

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainUtils.c
# Opt level: O0

void Abc_UtilsPrintUsage(Abc_Frame_t *pAbc,char *ProgName)

{
  char *ProgName_local;
  Abc_Frame_t *pAbc_local;
  
  fprintf((FILE *)pAbc->Err,"\n");
  fprintf((FILE *)pAbc->Err,
          "usage: %s [-c cmd] [-q cmd] [-C cmd] [-Q cmd] [-f script] [-h] [-o file] [-s] [-t type] [-T type] [-x] [-b] [file]\n"
          ,ProgName);
  fprintf((FILE *)pAbc->Err,"    -c cmd\texecute commands `cmd\'\n");
  fprintf((FILE *)pAbc->Err,"    -q cmd\texecute commands `cmd\' quietly\n");
  fprintf((FILE *)pAbc->Err,
          "    -C cmd\texecute commands `cmd\', then continue in interactive mode\n");
  fprintf((FILE *)pAbc->Err,
          "    -Q cmd\texecute commands `cmd\' quietly, then continue in interactive mode\n");
  fprintf((FILE *)pAbc->Err,"    -F script\texecute commands from a script file and echo commands\n"
         );
  fprintf((FILE *)pAbc->Err,"    -f script\texecute commands from a script file\n");
  fprintf((FILE *)pAbc->Err,"    -h\t\tprint the command usage\n");
  fprintf((FILE *)pAbc->Err,"    -o file\tspecify output filename to store the result\n");
  fprintf((FILE *)pAbc->Err,"    -s\t\tdo not read any initialization file\n");
  fprintf((FILE *)pAbc->Err,
          "    -t type\tspecify input type (blif_mv (default), blif_mvs, blif, or none)\n");
  fprintf((FILE *)pAbc->Err,
          "    -T type\tspecify output type (blif_mv (default), blif_mvs, blif, or none)\n");
  fprintf((FILE *)pAbc->Err,"    -x\t\tequivalent to \'-t none -T none\'\n");
  fprintf((FILE *)pAbc->Err,"    -b\t\trunning in bridge mode\n");
  fprintf((FILE *)pAbc->Err,"\n");
  return;
}

Assistant:

void Abc_UtilsPrintUsage( Abc_Frame_t * pAbc, char * ProgName )
{
    fprintf( pAbc->Err, "\n" );
    fprintf( pAbc->Err,
             "usage: %s [-c cmd] [-q cmd] [-C cmd] [-Q cmd] [-f script] [-h] [-o file] [-s] [-t type] [-T type] [-x] [-b] [file]\n",
             ProgName);
    fprintf( pAbc->Err, "    -c cmd\texecute commands `cmd'\n");
    fprintf( pAbc->Err, "    -q cmd\texecute commands `cmd' quietly\n");
    fprintf( pAbc->Err, "    -C cmd\texecute commands `cmd', then continue in interactive mode\n");
    fprintf( pAbc->Err, "    -Q cmd\texecute commands `cmd' quietly, then continue in interactive mode\n");
    fprintf( pAbc->Err, "    -F script\texecute commands from a script file and echo commands\n");
    fprintf( pAbc->Err, "    -f script\texecute commands from a script file\n");
    fprintf( pAbc->Err, "    -h\t\tprint the command usage\n");
    fprintf( pAbc->Err, "    -o file\tspecify output filename to store the result\n");
    fprintf( pAbc->Err, "    -s\t\tdo not read any initialization file\n");
    fprintf( pAbc->Err, "    -t type\tspecify input type (blif_mv (default), blif_mvs, blif, or none)\n");
    fprintf( pAbc->Err, "    -T type\tspecify output type (blif_mv (default), blif_mvs, blif, or none)\n");
    fprintf( pAbc->Err, "    -x\t\tequivalent to '-t none -T none'\n");
    fprintf( pAbc->Err, "    -b\t\trunning in bridge mode\n");
    fprintf( pAbc->Err, "\n" );
}